

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midi_timidity.cpp
# Opt level: O0

void __thiscall TimidityPPMIDIDevice::~TimidityPPMIDIDevice(TimidityPPMIDIDevice *this)

{
  TimidityPPMIDIDevice *this_local;
  
  (this->super_PseudoMIDIDevice).super_MIDIDevice._vptr_MIDIDevice =
       (_func_int **)&PTR__TimidityPPMIDIDevice_009f0a90;
  if (this->WavePipe[1] != -1) {
    close(this->WavePipe[1]);
    this->WavePipe[1] = -1;
  }
  if (this->WavePipe[0] != -1) {
    close(this->WavePipe[0]);
    this->WavePipe[0] = -1;
  }
  FString::~FString(&this->CommandLine);
  FTempFileName::~FTempFileName(&this->DiskName);
  PseudoMIDIDevice::~PseudoMIDIDevice(&this->super_PseudoMIDIDevice);
  return;
}

Assistant:

TimidityPPMIDIDevice::~TimidityPPMIDIDevice ()
{
#if _WIN32
	if (WriteWavePipe != INVALID_HANDLE_VALUE)
	{
		CloseHandle (WriteWavePipe);
		WriteWavePipe = INVALID_HANDLE_VALUE;
	}
	if (ReadWavePipe != INVALID_HANDLE_VALUE)
	{
		CloseHandle (ReadWavePipe);
		ReadWavePipe = INVALID_HANDLE_VALUE;
	}
#else
	if (WavePipe[1] != -1)
	{
		close (WavePipe[1]);
		WavePipe[1] = -1;
	}
	if (WavePipe[0] != -1)
	{
		close (WavePipe[0]);
		WavePipe[0] = -1;
	}
#endif
}